

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  void *__s;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  Gia_Obj_t *pGVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  
  uVar7 = vFfPerm->nSize;
  uVar15 = (ulong)uVar7;
  if (uVar7 != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaDup.c"
                  ,0x2e5,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  if (uVar15 == 0) {
    __s = (void *)0x0;
    uVar5 = 0;
  }
  else {
    piVar2 = vFfPerm->pArray;
    iVar6 = *piVar2;
    if (1 < (int)uVar7) {
      uVar8 = 1;
      do {
        if (iVar6 <= piVar2[uVar8]) {
          iVar6 = piVar2[uVar8];
        }
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    uVar5 = iVar6 + 1;
    if (iVar6 < 0) {
      __s = (void *)0x0;
    }
    else {
      __s = malloc((ulong)uVar5 << 2);
      if (__s == (void *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      memset(__s,0xff,(ulong)uVar5 << 2);
    }
    if (0 < (int)uVar7) {
      uVar8 = 0;
      do {
        uVar7 = piVar2[uVar8];
        if ((ulong)uVar7 != 0xffffffff) {
          if (((int)uVar7 < 0) || (iVar6 < (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)__s + (ulong)uVar7 * 4) = (int)uVar8;
        }
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  uVar15 = (ulong)(uint)p->nRegs;
  pVVar12 = p->vCis;
  iVar6 = pVVar12->nSize;
  if (p->nRegs < iVar6) {
    lVar19 = 0;
    do {
      if (iVar6 <= lVar19) goto LAB_00677f2e;
      iVar6 = pVVar12->pArray[lVar19];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00677f0f;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = p_00->pObjs;
      if ((pGVar11 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar11)) goto LAB_00677f4d;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = p_00->pObjs;
      if ((pGVar11 < pGVar13) || (pGVar13 + p_00->nObjs <= pGVar11)) goto LAB_00677f4d;
      pGVar4[iVar6].Value = (int)((ulong)((long)pGVar11 - (long)pGVar13) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
      uVar15 = (ulong)(uint)p->nRegs;
      pVVar12 = p->vCis;
      iVar6 = pVVar12->nSize;
    } while (lVar19 < iVar6 - p->nRegs);
  }
  if ((int)uVar15 < 1) {
    iVar6 = p->nObjs;
    if (0 < iVar6) goto LAB_00677ca4;
  }
  else {
    iVar16 = pVVar12->nSize;
    lVar19 = 0;
    do {
      uVar15 = (ulong)(uint)(iVar16 - (int)uVar15) + lVar19;
      iVar6 = (int)uVar15;
      if ((iVar6 < 0) || (iVar16 <= iVar6)) goto LAB_00677f2e;
      if ((pVVar12->pArray[uVar15 & 0xffffffff] < 0) ||
         (iVar6 = p->nObjs, iVar6 <= pVVar12->pArray[uVar15 & 0xffffffff])) goto LAB_00677f0f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar13 = Gia_ManAppendObj(p_00);
      uVar15 = *(ulong *)pGVar13;
      *(ulong *)pGVar13 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar13 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar13 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar13)) {
LAB_00677f4d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar13 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar13)) goto LAB_00677f4d;
      if ((int)uVar5 <= lVar19) goto LAB_00677f2e;
      iVar6 = *(int *)((long)__s + lVar19 * 4);
      uVar7 = p->nRegs;
      uVar15 = (ulong)uVar7;
      if ((int)uVar7 <= iVar6) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a8,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      pVVar12 = p->vCis;
      iVar16 = pVVar12->nSize;
      uVar14 = (iVar16 - uVar7) + iVar6;
      if (((int)uVar14 < 0) || (iVar16 <= (int)uVar14)) goto LAB_00677f2e;
      iVar17 = pVVar12->pArray[uVar14];
      if (((long)iVar17 < 0) || (iVar6 = p->nObjs, iVar6 <= iVar17)) goto LAB_00677f0f;
      p->pObjs[iVar17].Value = (int)((ulong)((long)pGVar13 - (long)pGVar4) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
    } while (lVar19 < (int)uVar7);
LAB_00677ca4:
    lVar18 = 8;
    lVar19 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar15 = *(ulong *)((long)pGVar4 + lVar18 + -8);
      if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar15) {
        uVar7 = *(uint *)((long)pGVar4 +
                         lVar18 + (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar14 = *(uint *)((long)pGVar4 +
                              lVar18 + (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar14 < 0)) goto LAB_00677f6c;
        iVar6 = Gia_ManAppendAnd(p_00,uVar7 ^ (uint)(uVar15 >> 0x1d) & 1,
                                 uVar14 ^ (uint)(uVar15 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar18) = iVar6;
        iVar6 = p->nObjs;
      }
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < iVar6);
    uVar15 = (ulong)(uint)p->nRegs;
  }
  pVVar12 = p->vCos;
  iVar6 = pVVar12->nSize;
  if ((int)uVar15 < iVar6) {
    lVar19 = 0;
    do {
      if (iVar6 <= lVar19) goto LAB_00677f2e;
      iVar6 = pVVar12->pArray[lVar19];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_00677f0f;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar6;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
      goto LAB_00677f6c;
      uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar7;
      lVar19 = lVar19 + 1;
      uVar15 = (ulong)(uint)p->nRegs;
      pVVar12 = p->vCos;
      iVar6 = pVVar12->nSize;
    } while (lVar19 < iVar6 - p->nRegs);
  }
  iVar6 = (int)uVar15;
  if (iVar6 < 1) {
LAB_00677ee0:
    if (__s == (void *)0x0) goto LAB_00677ef5;
  }
  else {
    lVar19 = 0;
    do {
      iVar16 = p->vCos->nSize;
      iVar6 = (int)uVar15;
      uVar15 = (ulong)(uint)(iVar16 - iVar6) + lVar19;
      iVar17 = (int)uVar15;
      if ((iVar17 < 0) || (iVar16 <= iVar17)) {
LAB_00677f2e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = p->vCos->pArray;
      iVar17 = piVar2[uVar15 & 0xffffffff];
      if (((long)iVar17 < 0) || (p->nObjs <= iVar17)) {
LAB_00677f0f:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_00677ee0;
      if ((int)uVar5 <= lVar19) goto LAB_00677f2e;
      iVar1 = *(int *)((long)__s + lVar19 * 4);
      if (iVar6 <= iVar1) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a9,"Gia_Obj_t *Gia_ManRi(Gia_Man_t *, int)");
      }
      uVar7 = iVar1 + (iVar16 - iVar6);
      if (((int)uVar7 < 0) || (iVar16 <= (int)uVar7)) goto LAB_00677f2e;
      uVar7 = piVar2[uVar7];
      if (((long)(int)uVar7 < 0) || ((uint)p->nObjs <= uVar7)) goto LAB_00677f0f;
      uVar14 = (uint)*(undefined8 *)(pGVar4 + (int)uVar7);
      uVar7 = (pGVar4 + (int)uVar7)[-(ulong)(uVar14 & 0x1fffffff)].Value;
      if ((int)uVar7 < 0) {
LAB_00677f6c:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = Gia_ManAppendCo(p_00,uVar14 >> 0x1d & 1 ^ uVar7);
      pGVar4[iVar17].Value = uVar7;
      lVar19 = lVar19 + 1;
      uVar15 = (ulong)p->nRegs;
    } while (lVar19 < (long)uVar15);
  }
  free(__s);
  iVar6 = p->nRegs;
LAB_00677ef5:
  Gia_ManSetRegNum(p_00,iVar6);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
    Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}